

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

void __thiscall
Disa::Adjacency_Graph<true>::Adjacency_Graph
          (Adjacency_Graph<true> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  Edge *pEVar1;
  long lVar2;
  ulong __n;
  Edge *pEVar3;
  Edge *edge;
  Edge *pEVar4;
  ulong uVar5;
  const_iterator __begin2;
  
  __n = edge_graph._M_len;
  edge = edge_graph._M_array;
  uVar5 = __n * 0x10;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar3 = edge;
  if (1 < __n) {
    lVar2 = uVar5 - 0x10;
    pEVar4 = edge;
    pEVar1 = edge;
    do {
      pEVar3 = pEVar1 + 1;
      if (pEVar1[1].second <= pEVar4->second) {
        pEVar3 = pEVar4;
      }
      lVar2 = lVar2 + -0x10;
      pEVar4 = pEVar3;
      pEVar1 = pEVar1 + 1;
    } while (lVar2 != 0);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->offset,pEVar3->first + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->vertex_adjacent_list,__n);
  while (__n != 0) {
    insert(this,edge);
    edge = edge + 1;
    uVar5 = uVar5 - 0x10;
    __n = uVar5;
  }
  if ((this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(&this->vertex_adjacent_list);
  }
  if ((this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage ==
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
  _S_do_it(&this->offset);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}